

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.cpp
# Opt level: O1

shared_ptr<const_Map_Item> __thiscall Map::GetItem(Map *this,short uid)

{
  World *pWVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  short sVar2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  undefined6 in_register_00000032;
  long *plVar3;
  long *plVar4;
  bool bVar5;
  shared_ptr<const_Map_Item> sVar6;
  
  plVar3 = *(long **)(CONCAT62(in_register_00000032,uid) + 0x68);
  plVar4 = (long *)(CONCAT62(in_register_00000032,uid) + 0x68);
  bVar5 = plVar3 == plVar4;
  if (!bVar5) {
    sVar2 = (short)in_RDX._M_pi;
    do {
      pWVar1 = (World *)plVar3[2];
      this_00 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)plVar3[3];
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        if (__libc_single_threaded == '\0') {
          LOCK();
          this_00->_M_use_count = this_00->_M_use_count + 1;
          UNLOCK();
        }
        else {
          this_00->_M_use_count = this_00->_M_use_count + 1;
        }
      }
      if ((short)pWVar1->last_character_id == sVar2) {
        this->world = pWVar1;
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)&this->id = this_00;
        if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          if (__libc_single_threaded == '\0') {
            LOCK();
            this_00->_M_use_count = this_00->_M_use_count + 1;
            UNLOCK();
          }
          else {
            this_00->_M_use_count = this_00->_M_use_count + 1;
          }
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
            in_RDX._M_pi = extraout_RDX_00;
          }
        }
        if (!bVar5) goto LAB_00167eaa;
        break;
      }
      if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
        in_RDX._M_pi = extraout_RDX;
      }
      plVar3 = (long *)*plVar3;
      bVar5 = plVar3 == plVar4;
    } while (!bVar5);
  }
  this->world = (World *)0x0;
  this->id = 0;
  this->rid[0] = '\0';
  this->rid[1] = '\0';
  this->rid[2] = '\0';
  this->rid[3] = '\0';
  this->pk = false;
  this->field_0xf = 0;
LAB_00167eaa:
  sVar6.super___shared_ptr<const_Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  sVar6.super___shared_ptr<const_Map_Item,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
  ;
  return (shared_ptr<const_Map_Item>)
         sVar6.super___shared_ptr<const_Map_Item,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<const Map_Item> Map::GetItem(short uid) const
{
	UTIL_FOREACH(this->items, item)
	{
		if (item->uid == uid)
		{
			return item;
		}
	}

	return std::shared_ptr<Map_Item>();
}